

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::calc_live_intervals(RegAllocator *this)

{
  bool bVar1;
  Reg r;
  size_type sVar2;
  uint *__x;
  reference puVar3;
  long lVar4;
  ulong uVar5;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_unsigned_int>_>,_bool> pVar8;
  exception *i_1;
  int bb_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  size_type bb_id_idx;
  LabelInst *x_8;
  uint rd_3;
  iterator __end12_1;
  iterator __begin12_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range12_1;
  uint rd_2;
  iterator __end12;
  iterator __begin12;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range12;
  PushPopInst *x_7;
  uint rd_1;
  iterator __end11_1;
  iterator __begin11_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range11_1;
  uint rd;
  iterator __end11;
  iterator __begin11;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range11;
  MultLoadStoreInst *x_6;
  add_pointer_t<arm::MemoryOperand> mem;
  LoadStoreInst *x_5;
  BrInst *x_4;
  add_pointer_t<arm::RegisterOperand> r2;
  Arith2Inst *x_3;
  Arith3Inst *x_2;
  Arith4Inst *x_1;
  PureInst *x;
  Inst *inst_;
  int i;
  int curr_bb;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc64;
  MemoryOperand *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  uint in_stack_fffffffffffffc74;
  Operand2 *in_stack_fffffffffffffc78;
  RegAllocator *in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc98;
  Reg in_stack_fffffffffffffc9c;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  long local_338;
  long in_stack_fffffffffffffcd8;
  RegAllocator *in_stack_fffffffffffffce0;
  long local_318;
  long local_308;
  long local_2f8;
  long local_2c8;
  long local_2b8;
  long local_2a8;
  long local_298;
  pair<const_int,_unsigned_int> local_160;
  int local_158 [4];
  string local_148 [32];
  undefined8 local_128;
  long local_120;
  uint local_114;
  _Self local_110;
  _Self local_108;
  long local_100;
  uint local_f4;
  _Self local_f0;
  _Self local_e8;
  long local_e0;
  long local_d8;
  uint local_cc;
  _Self local_c8;
  _Self local_c0;
  long local_b8;
  uint local_ac;
  _Self local_a8;
  _Self local_a0;
  long local_98;
  long local_90;
  add_pointer_t<arm::MemoryOperand> local_88;
  long local_80;
  _Base_ptr local_78;
  undefined1 local_70;
  long local_68;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_60;
  undefined1 local_58;
  Reg local_4c;
  pair<const_unsigned_int,_unsigned_int> local_48;
  add_pointer_t<arm::RegisterOperand> local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  RegAllocator *local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; uVar5 = (ulong)local_10,
      sVar2 = std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)(*in_RDI + 0x28)), uVar5 < sVar2; local_10 = local_10 + 1) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  *)(*in_RDI + 0x28),(long)local_10);
    local_18 = (RegAllocator *)
               std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                         ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    if (local_18 == (RegAllocator *)0x0) {
      local_298 = 0;
    }
    else {
      local_298 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::PureInst::typeinfo,0);
    }
    local_20 = local_298;
    if (local_298 == 0) {
      if (local_18 == (RegAllocator *)0x0) {
        local_2a8 = 0;
      }
      else {
        local_2a8 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith4Inst::typeinfo,0);
      }
      local_28 = local_2a8;
      if (local_2a8 == 0) {
        if (local_18 == (RegAllocator *)0x0) {
          local_2b8 = 0;
        }
        else {
          local_2b8 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith3Inst::typeinfo,0);
        }
        local_30 = local_2b8;
        if (local_2b8 == 0) {
          if (local_18 == (RegAllocator *)0x0) {
            local_2c8 = 0;
          }
          else {
            local_2c8 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
          }
          local_38 = local_2c8;
          if (local_2c8 == 0) {
            if (local_18 == (RegAllocator *)0x0) {
              local_2f8 = 0;
            }
            else {
              local_2f8 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::BrInst::typeinfo,0);
            }
            local_68 = local_2f8;
            if (local_2f8 == 0) {
              if (local_18 == (RegAllocator *)0x0) {
                local_308 = 0;
              }
              else {
                local_308 = __dynamic_cast(local_18,&arm::Inst::typeinfo,
                                           &arm::LoadStoreInst::typeinfo,0);
              }
              local_80 = local_308;
              if (local_308 == 0) {
                if (local_18 == (RegAllocator *)0x0) {
                  local_318 = 0;
                }
                else {
                  local_318 = __dynamic_cast(local_18,&arm::Inst::typeinfo,
                                             &arm::MultLoadStoreInst::typeinfo,0);
                }
                local_90 = local_318;
                if (local_318 == 0) {
                  in_stack_fffffffffffffce0 = local_18;
                  if (local_18 == (RegAllocator *)0x0) {
                    in_stack_fffffffffffffcd8 = 0;
                  }
                  else {
                    in_stack_fffffffffffffcd8 =
                         __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::PushPopInst::typeinfo,0)
                    ;
                  }
                  local_d8 = in_stack_fffffffffffffcd8;
                  if (in_stack_fffffffffffffcd8 == 0) {
                    if (local_18 == (RegAllocator *)0x0) {
                      local_338 = 0;
                    }
                    else {
                      local_338 = __dynamic_cast(local_18,&arm::Inst::typeinfo,
                                                 &arm::LabelInst::typeinfo,0);
                    }
                    local_120 = local_338;
                    if ((local_338 != 0) &&
                       (lVar4 = std::__cxx11::string::find((char *)(local_338 + 0x10),0x2cc755),
                       lVar4 == 0)) {
                      local_128 = std::__cxx11::string::find_last_of
                                            ((char *)(local_120 + 0x10),0x2cd0f0);
                      std::__cxx11::string::substr((ulong)local_148,local_120 + 0x10);
                      local_158[0] = std::__cxx11::stoi((string *)
                                                        CONCAT44(in_stack_fffffffffffffc64,
                                                                 in_stack_fffffffffffffc60),
                                                        (size_t *)in_stack_fffffffffffffc58,0);
                      std::pair<const_int,_unsigned_int>::pair<int_&,_int_&,_true>
                                (&local_160,&local_10,local_158);
                      pVar8 = std::
                              map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                              ::insert((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                       (value_type *)in_stack_fffffffffffffc68);
                      in_stack_fffffffffffffca7 = pVar8.second;
                      local_c = local_158[0];
                      std::__cxx11::string::~string(local_148);
                    }
                  }
                  else if (*(int *)(in_stack_fffffffffffffcd8 + 8) == 0x1e) {
                    local_e0 = in_stack_fffffffffffffcd8 + 0x10;
                    local_e8._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         begin(in_stack_fffffffffffffc58);
                    local_f0._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         end(in_stack_fffffffffffffc58);
                    while (bVar1 = std::operator!=(&local_e8,&local_f0), bVar1) {
                      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                         ((_Rb_tree_const_iterator<unsigned_int> *)0x238351);
                      local_f4 = *puVar3;
                      add_reg_write(in_stack_fffffffffffffce0,
                                    (Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                                    (uint)in_stack_fffffffffffffcd8);
                      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                                ((_Rb_tree_const_iterator<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                    }
                  }
                  else {
                    local_100 = in_stack_fffffffffffffcd8 + 0x10;
                    local_108._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         begin(in_stack_fffffffffffffc58);
                    local_110._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         end(in_stack_fffffffffffffc58);
                    while (bVar1 = std::operator!=(&local_108,&local_110), bVar1) {
                      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                         ((_Rb_tree_const_iterator<unsigned_int> *)0x2383ef);
                      local_114 = *puVar3;
                      add_reg_read((RegAllocator *)
                                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                                   in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
                      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                                ((_Rb_tree_const_iterator<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                    }
                  }
                }
                else {
                  if (*(int *)(local_318 + 8) == 0x1b) {
                    local_98 = local_318 + 0x10;
                    local_a0._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         begin(in_stack_fffffffffffffc58);
                    local_a8._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         end(in_stack_fffffffffffffc58);
                    while (bVar1 = std::operator!=(&local_a0,&local_a8), bVar1) {
                      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                         ((_Rb_tree_const_iterator<unsigned_int> *)0x238178);
                      local_ac = *puVar3;
                      add_reg_write(in_stack_fffffffffffffce0,
                                    (Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                                    (uint)in_stack_fffffffffffffcd8);
                      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                                ((_Rb_tree_const_iterator<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                    }
                  }
                  else {
                    local_b8 = local_318 + 0x10;
                    local_c0._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         begin(in_stack_fffffffffffffc58);
                    local_c8._M_node =
                         (_Base_ptr)
                         std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         end(in_stack_fffffffffffffc58);
                    while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
                      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                         ((_Rb_tree_const_iterator<unsigned_int> *)0x238216);
                      local_cc = *puVar3;
                      add_reg_read((RegAllocator *)
                                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                                   in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
                      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                                ((_Rb_tree_const_iterator<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                    }
                  }
                  add_reg_read((RegAllocator *)
                               CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                               in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
                }
              }
              else {
                if (*(int *)(local_308 + 8) == 0x1a) {
                  add_reg_write(in_stack_fffffffffffffce0,
                                (Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                                (uint)in_stack_fffffffffffffcd8);
                }
                else {
                  add_reg_read((RegAllocator *)
                               CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                               in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
                }
                local_88 = std::get_if<arm::MemoryOperand,std::__cxx11::string,arm::MemoryOperand>
                                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                       *)0x238062);
                if (local_88 != (add_pointer_t<arm::MemoryOperand>)0x0) {
                  add_reg_read((RegAllocator *)
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                               in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
                }
              }
            }
            else if (*(int *)(local_2f8 + 8) == 2) {
              pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffc80,
                                 (value_type_conflict3 *)in_stack_fffffffffffffc78);
              local_78 = (_Base_ptr)pVar7.first._M_node;
              local_70 = pVar7.second;
            }
          }
          else {
            if (((*(int *)(local_2c8 + 8) == 6) || (*(int *)(local_2c8 + 8) == 7)) ||
               (*(int *)(local_2c8 + 8) == 8)) {
              add_reg_write(in_stack_fffffffffffffce0,
                            (Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                            (uint)in_stack_fffffffffffffcd8);
              local_40 = std::get_if<arm::RegisterOperand,arm::RegisterOperand,int>
                                   ((variant<arm::RegisterOperand,_int> *)0x237db4);
              if (((*(int *)(local_38 + 8) == 6) &&
                  (local_40 != (add_pointer_t<arm::RegisterOperand>)0x0)) &&
                 ((local_40->shift_amount == '\0' &&
                  (bVar1 = arm::is_virtual_register(*(Reg *)(local_38 + 0x10)), !bVar1)))) {
                r = arm::Operand2::get_reg((Operand2 *)0x237e1b);
                bVar1 = arm::is_virtual_register(r);
                if (!bVar1) {
                  __x = (uint *)(local_38 + 0x10);
                  local_4c = arm::Operand2::get_reg((Operand2 *)0x237e65);
                  std::pair<const_unsigned_int,_unsigned_int>::
                  pair<unsigned_int_&,_unsigned_int,_true>(&local_48,__x,&local_4c);
                  pVar6 = std::
                          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::insert((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                   (value_type *)in_stack_fffffffffffffc68);
                  local_60._M_cur =
                       (__node_type *)
                       pVar6.first.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur;
                  local_58 = pVar6.second;
                }
              }
            }
            else {
              add_reg_read((RegAllocator *)
                           CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                           in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
            }
            add_reg_read(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc74);
          }
        }
        else {
          add_reg_read((RegAllocator *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0)
                       ,in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
          add_reg_read(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74
                      );
          add_reg_write(in_stack_fffffffffffffce0,(Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                        (uint)in_stack_fffffffffffffcd8);
        }
      }
      else {
        add_reg_read((RegAllocator *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
        add_reg_read((RegAllocator *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
        add_reg_read((RegAllocator *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
        add_reg_write(in_stack_fffffffffffffce0,(Reg)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                      (uint)in_stack_fffffffffffffcd8);
      }
    }
  }
  return;
}

Assistant:

void RegAllocator::calc_live_intervals() {
  int curr_bb = 0;
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    if (auto x = dynamic_cast<PureInst *>(inst_)) {
      //   noop
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_read(x->r3, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::MovT ||
          x->op == arm::OpCode::Mvn) {
        add_reg_write(x->r1, i);
        if (auto r2 = std::get_if<RegisterOperand>(&x->r2);
            x->op == arm::OpCode::Mov && r2 && r2->shift_amount == 0) {
          if (!is_virtual_register(x->r1) &&
              !is_virtual_register(x->r2.get_reg()))
            reg_affine.insert({x->r1, x->r2.get_reg()});
        }
      } else {
        add_reg_read(x->r1, i);
      }
      add_reg_read(x->r2, i);
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (x->op == arm::OpCode::Bl) {
        bl_points.insert(i);
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdR) {
        add_reg_write(x->rd, i);
      } else {
        // StR
        add_reg_read(x->rd, i);
      }
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) add_reg_read(*mem, i);
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      if (x->op == arm::OpCode::Push) {
        for (auto rd : x->regs) add_reg_write(rd, i);
      } else {
        // pop
        for (auto rd : x->regs) add_reg_read(rd, i);
      }
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      if (x->label.find(".bb_") == 0) {
        try {
          auto bb_id_idx = x->label.find_last_of("$");
          auto id_str = x->label.substr(bb_id_idx + 1);
          auto bb_id = std::stoi(id_str);
          point_bb_map.insert({i, bb_id});
          curr_bb = bb_id;
        } catch (std::exception &i) {
          LOG(WARNING) << typeid(i).name() << ": " << i.what() << std::endl;
        }
      }
    } else
      //   noop
      ;
  }
}